

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExternalMakefileProjectGenerator.cxx
# Opt level: O1

string * __thiscall
cmExternalMakefileProjectGeneratorFactory::GetDocumentation_abi_cxx11_
          (string *__return_storage_ptr__,cmExternalMakefileProjectGeneratorFactory *this)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->Documentation)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->Documentation)._M_string_length
            );
  return __return_storage_ptr__;
}

Assistant:

std::string cmExternalMakefileProjectGeneratorFactory::GetDocumentation() const
{
  return this->Documentation;
}